

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O1

void TestFastDtoaPrecisionVariousDoubles(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  Vector<char> representation;
  Vector<char> representation_00;
  Vector<char> representation_01;
  Vector<char> representation_02;
  Vector<char> representation_03;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff78;
  undefined8 uVar14;
  int local_80;
  int local_7c;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char local_68;
  char cStack_67;
  char cStack_66;
  
  uVar3 = 3;
  buffer._8_8_ = &local_7c;
  buffer.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.0,FAST_DTOA_PRECISION|FAST_DTOA_SHORTEST_SINGLE,
                     (int)&local_78,buffer,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    pcVar2 = "status";
    uVar3 = 0xd1;
    goto LAB_00863bf8;
  }
  if (3 < local_7c) {
    pcVar2 = "3 >= length";
    uVar3 = 0xd2;
    goto LAB_00863bf8;
  }
  representation._8_8_ = uVar3;
  representation.start_ = &local_78;
  TrimRepresentation(representation);
  if (CONCAT11(cStack_77,local_78) != 0x31) {
    pcVar2 = "\"1\"";
    pcVar4 = "1";
    uVar3 = 0xd4;
    goto LAB_00863c30;
  }
  if (local_80 != 1) {
    uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0xd5;
LAB_00863bd3:
    pcVar2 = "1";
    uVar5 = 1;
    goto LAB_00863c66;
  }
  uVar3 = 10;
  buffer_00._8_8_ = &local_7c;
  buffer_00.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.5,10,(int)&local_78,buffer_00,&local_80,
                     in_stack_ffffffffffffff78);
  if (bVar1) {
    if (10 < local_7c) {
      pcVar2 = "10 >= length";
      uVar3 = 0xd9;
      goto LAB_00863bf8;
    }
    representation_00._8_8_ = uVar3;
    representation_00.start_ = &local_78;
    TrimRepresentation(representation_00);
    if (cStack_76 != '\0' || CONCAT11(cStack_77,local_78) != 0x3531) {
      pcVar2 = "\"15\"";
      pcVar4 = "15";
      uVar3 = 0xdb;
      goto LAB_00863c30;
    }
    if (local_80 != 1) {
      uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar3 = 0xdc;
      goto LAB_00863bd3;
    }
  }
  buffer_01._8_8_ = &local_7c;
  buffer_01.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4.94065645841247e-324,5,(int)&local_78,buffer_01,
                     &local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    pcVar2 = "status";
    uVar3 = 0xe2;
    goto LAB_00863bf8;
  }
  if (CONCAT11(cStack_73,cStack_74) != 0x37 ||
      CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,local_78))) != 0x30343934) {
    pcVar2 = "\"49407\"";
    pcVar4 = "49407";
    uVar3 = 0xe3;
    goto LAB_00863c30;
  }
  if (local_80 != -0x143) {
    uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "-323";
    uVar3 = 0xe4;
    uVar5 = 0xfffffebd;
    goto LAB_00863c66;
  }
  buffer_02._8_8_ = &local_7c;
  buffer_02.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.79769313486232e+308,7,(int)&local_78,buffer_02,
                     &local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    pcVar2 = "status";
    uVar3 = 0xe9;
    goto LAB_00863bf8;
  }
  if (CONCAT17(cStack_71,
               CONCAT16(cStack_72,
                        CONCAT15(cStack_73,
                                 CONCAT14(cStack_74,
                                          CONCAT13(cStack_75,
                                                   CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)))
                                         )))) != 0x33393637393731) {
    pcVar2 = "\"1797693\"";
    pcVar4 = "1797693";
    uVar3 = 0xea;
    goto LAB_00863c30;
  }
  if (local_80 != 0x135) {
    uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "309";
    uVar3 = 0xeb;
    uVar5 = 0x135;
    goto LAB_00863c66;
  }
  uVar3 = 0xe;
  buffer_03._8_8_ = &local_7c;
  buffer_03.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4294967272.0,0xe,(int)&local_78,buffer_03,&local_80,
                     in_stack_ffffffffffffff78);
  if (bVar1) {
    if (0xe < local_7c) {
      pcVar2 = "14 >= length";
      uVar3 = 0xf0;
      goto LAB_00863bf8;
    }
    representation_01._8_8_ = uVar3;
    representation_01.start_ = &local_78;
    TrimRepresentation(representation_01);
    if (CONCAT17(cStack_6e,
                 CONCAT16(cStack_6f,
                          CONCAT15(cStack_70,
                                   CONCAT14(cStack_71,
                                            CONCAT13(cStack_72,
                                                     CONCAT12(cStack_73,
                                                              CONCAT11(cStack_74,cStack_75))))))) !=
        0x32373237363934 ||
        CONCAT17(cStack_71,
                 CONCAT16(cStack_72,
                          CONCAT15(cStack_73,
                                   CONCAT14(cStack_74,
                                            CONCAT13(cStack_75,
                                                     CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)
                                                             )))))) != 0x3237363934393234) {
      pcVar2 = "\"4294967272\"";
      pcVar4 = "4294967272";
      uVar3 = 0xf2;
      goto LAB_00863c30;
    }
    if (local_80 == 10) goto LAB_00863238;
    uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0xf3;
LAB_00863c60:
    pcVar2 = "10";
    uVar5 = 10;
  }
  else {
LAB_00863238:
    buffer_04._8_8_ = &local_7c;
    buffer_04.start_ = (char *)0x64;
    bVar1 = double_conversion::FastDtoa
                      ((double_conversion *)0x2,4.185580496821357e+298,0x11,(int)&local_78,buffer_04
                       ,&local_80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      pcVar2 = "status";
      uVar3 = 0xf8;
      goto LAB_00863bf8;
    }
    auVar6[0] = -(local_78 == '4');
    auVar6[1] = -(cStack_77 == '1');
    auVar6[2] = -(cStack_76 == '8');
    auVar6[3] = -(cStack_75 == '5');
    auVar6[4] = -(cStack_74 == '5');
    auVar6[5] = -(cStack_73 == '8');
    auVar6[6] = -(cStack_72 == '0');
    auVar6[7] = -(cStack_71 == '4');
    auVar6[8] = -(cStack_70 == '9');
    auVar6[9] = -(cStack_6f == '6');
    auVar6[10] = -(cStack_6e == '8');
    auVar6[0xb] = -(cStack_6d == '2');
    auVar6[0xc] = -(cStack_6c == '1');
    auVar6[0xd] = -(cStack_6b == '3');
    auVar6[0xe] = -(cStack_6a == '5');
    auVar6[0xf] = -(cStack_69 == '6');
    auVar10[0] = -((char)_local_68 == '7');
    auVar10[1] = -((char)((ushort)_local_68 >> 8) == '\0');
    auVar10[2] = 0xff;
    auVar10[3] = 0xff;
    auVar10[4] = 0xff;
    auVar10[5] = 0xff;
    auVar10[6] = 0xff;
    auVar10[7] = 0xff;
    auVar10[8] = 0xff;
    auVar10[9] = 0xff;
    auVar10[10] = 0xff;
    auVar10[0xb] = 0xff;
    auVar10[0xc] = 0xff;
    auVar10[0xd] = 0xff;
    auVar10[0xe] = 0xff;
    auVar10[0xf] = 0xff;
    auVar10 = auVar10 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
      pcVar2 = "\"41855804968213567\"";
      pcVar4 = "41855804968213567";
      uVar3 = 0xf9;
LAB_00863c30:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
             ,uVar3,pcVar2,"buffer.start()",pcVar4,&local_78);
      abort();
    }
    if (local_80 == 299) {
      buffer_05._8_8_ = &local_7c;
      buffer_05.start_ = (char *)0x64;
      bVar1 = double_conversion::FastDtoa
                        ((double_conversion *)0x2,5.562684646268003e-309,FAST_DTOA_SHORTEST_SINGLE,
                         (int)&local_78,buffer_05,&local_80,in_stack_ffffffffffffff78);
      if (!bVar1) {
        pcVar2 = "status";
        uVar3 = 0xfe;
        goto LAB_00863bf8;
      }
      if (CONCAT11(cStack_77,local_78) != 0x36) {
        pcVar2 = "\"6\"";
        pcVar4 = "6";
        uVar3 = 0xff;
        goto LAB_00863c30;
      }
      if (local_80 != -0x134) {
        uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
        pcVar2 = "-308";
        uVar3 = 0x100;
        uVar5 = 0xfffffecc;
        goto LAB_00863c66;
      }
      buffer_06._8_8_ = &local_7c;
      buffer_06.start_ = (char *)0x64;
      bVar1 = double_conversion::FastDtoa
                        ((double_conversion *)0x2,2147483648.0,5,(int)&local_78,buffer_06,&local_80,
                         in_stack_ffffffffffffff78);
      if (!bVar1) {
        pcVar2 = "status";
        uVar3 = 0x104;
        goto LAB_00863bf8;
      }
      if (CONCAT11(cStack_73,cStack_74) != 0x35 ||
          CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,local_78))) != 0x37343132) {
        pcVar2 = "\"21475\"";
        pcVar4 = "21475";
        uVar3 = 0x105;
        goto LAB_00863c30;
      }
      if (local_80 != 10) {
        uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
        uVar3 = 0x106;
        goto LAB_00863c60;
      }
      uVar3 = 10;
      buffer_07._8_8_ = &local_7c;
      buffer_07.start_ = (char *)0x64;
      bVar1 = double_conversion::FastDtoa
                        ((double_conversion *)0x2,3.5844466002796428e+298,10,(int)&local_78,
                         buffer_07,&local_80,in_stack_ffffffffffffff78);
      if (!bVar1) {
        pcVar2 = "status";
        uVar3 = 0x10a;
LAB_00863bf8:
        printf("%s:%d:\n CHECK(%s) failed\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
               ,uVar3,pcVar2);
        abort();
      }
      if (10 < local_7c) {
        pcVar2 = "10 >= length";
        uVar3 = 0x10b;
        goto LAB_00863bf8;
      }
      representation_02._8_8_ = uVar3;
      representation_02.start_ = &local_78;
      TrimRepresentation(representation_02);
      if (cStack_70 != '\0' ||
          CONCAT17(cStack_71,
                   CONCAT16(cStack_72,
                            CONCAT15(cStack_73,
                                     CONCAT14(cStack_74,
                                              CONCAT13(cStack_75,
                                                       CONCAT12(cStack_76,
                                                                CONCAT11(cStack_77,local_78)))))))
          != 0x3636343434383533) {
        pcVar2 = "\"35844466\"";
        pcVar4 = "35844466";
        uVar3 = 0x10d;
        goto LAB_00863c30;
      }
      if (local_80 == 299) {
        buffer_08._8_8_ = &local_7c;
        buffer_08.start_ = (char *)0x64;
        bVar1 = double_conversion::FastDtoa
                          ((double_conversion *)0x2,2.2250738585072014e-308,0x11,(int)&local_78,
                           buffer_08,&local_80,in_stack_ffffffffffffff78);
        if (!bVar1) {
          pcVar2 = "status";
          uVar3 = 0x113;
          goto LAB_00863bf8;
        }
        auVar7[0] = -(local_78 == '2');
        auVar7[1] = -(cStack_77 == '2');
        auVar7[2] = -(cStack_76 == '2');
        auVar7[3] = -(cStack_75 == '5');
        auVar7[4] = -(cStack_74 == '0');
        auVar7[5] = -(cStack_73 == '7');
        auVar7[6] = -(cStack_72 == '3');
        auVar7[7] = -(cStack_71 == '8');
        auVar7[8] = -(cStack_70 == '5');
        auVar7[9] = -(cStack_6f == '8');
        auVar7[10] = -(cStack_6e == '5');
        auVar7[0xb] = -(cStack_6d == '0');
        auVar7[0xc] = -(cStack_6c == '7');
        auVar7[0xd] = -(cStack_6b == '2');
        auVar7[0xe] = -(cStack_6a == '0');
        auVar7[0xf] = -(cStack_69 == '1');
        auVar11[0] = -((char)_local_68 == '4');
        auVar11[1] = -((char)((ushort)_local_68 >> 8) == '\0');
        auVar11[2] = 0xff;
        auVar11[3] = 0xff;
        auVar11[4] = 0xff;
        auVar11[5] = 0xff;
        auVar11[6] = 0xff;
        auVar11[7] = 0xff;
        auVar11[8] = 0xff;
        auVar11[9] = 0xff;
        auVar11[10] = 0xff;
        auVar11[0xb] = 0xff;
        auVar11[0xc] = 0xff;
        auVar11[0xd] = 0xff;
        auVar11[0xe] = 0xff;
        auVar11[0xf] = 0xff;
        auVar11 = auVar11 & auVar7;
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
          pcVar2 = "\"22250738585072014\"";
          pcVar4 = "22250738585072014";
          uVar3 = 0x114;
          goto LAB_00863c30;
        }
        if (local_80 == -0x133) {
          uVar3 = 0x11;
          buffer_09._8_8_ = &local_7c;
          buffer_09.start_ = (char *)0x64;
          bVar1 = double_conversion::FastDtoa
                            ((double_conversion *)0x2,2.225073858507201e-308,0x11,(int)&local_78,
                             buffer_09,&local_80,in_stack_ffffffffffffff78);
          if (!bVar1) {
            pcVar2 = "status";
            uVar3 = 0x11a;
            goto LAB_00863bf8;
          }
          if (0x14 < local_7c) {
            pcVar2 = "20 >= length";
            uVar3 = 0x11b;
            goto LAB_00863bf8;
          }
          representation_03._8_8_ = uVar3;
          representation_03.start_ = &local_78;
          TrimRepresentation(representation_03);
          auVar8[0] = -(local_78 == '2');
          auVar8[1] = -(cStack_77 == '2');
          auVar8[2] = -(cStack_76 == '2');
          auVar8[3] = -(cStack_75 == '5');
          auVar8[4] = -(cStack_74 == '0');
          auVar8[5] = -(cStack_73 == '7');
          auVar8[6] = -(cStack_72 == '3');
          auVar8[7] = -(cStack_71 == '8');
          auVar8[8] = -(cStack_70 == '5');
          auVar8[9] = -(cStack_6f == '8');
          auVar8[10] = -(cStack_6e == '5');
          auVar8[0xb] = -(cStack_6d == '0');
          auVar8[0xc] = -(cStack_6c == '7');
          auVar8[0xd] = -(cStack_6b == '2');
          auVar8[0xe] = -(cStack_6a == '0');
          auVar8[0xf] = -(cStack_69 == '0');
          auVar12[0] = -((char)_local_68 == '9');
          auVar12[1] = -((char)((ushort)_local_68 >> 8) == '\0');
          auVar12[2] = 0xff;
          auVar12[3] = 0xff;
          auVar12[4] = 0xff;
          auVar12[5] = 0xff;
          auVar12[6] = 0xff;
          auVar12[7] = 0xff;
          auVar12[8] = 0xff;
          auVar12[9] = 0xff;
          auVar12[10] = 0xff;
          auVar12[0xb] = 0xff;
          auVar12[0xc] = 0xff;
          auVar12[0xd] = 0xff;
          auVar12[0xe] = 0xff;
          auVar12[0xf] = 0xff;
          auVar12 = auVar12 & auVar8;
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) {
            pcVar2 = "\"22250738585072009\"";
            pcVar4 = "22250738585072009";
            uVar3 = 0x11d;
            goto LAB_00863c30;
          }
          if (local_80 == -0x133) {
            buffer_10._8_8_ = &local_7c;
            buffer_10.start_ = (char *)0x64;
            bVar1 = double_conversion::FastDtoa
                              ((double_conversion *)0x2,3.316133905216739e-237,0x12,(int)&local_78,
                               buffer_10,&local_80,in_stack_ffffffffffffff78);
            if (!bVar1) {
              pcVar2 = "status";
              uVar3 = 0x122;
              goto LAB_00863bf8;
            }
            auVar13[0] = -(cStack_75 == '6');
            auVar13[1] = -(cStack_74 == '1');
            auVar13[2] = -(cStack_73 == '3');
            auVar13[3] = -(cStack_72 == '3');
            auVar13[4] = -(cStack_71 == '9');
            auVar13[5] = -(cStack_70 == '0');
            auVar13[6] = -(cStack_6f == '5');
            auVar13[7] = -(cStack_6e == '2');
            auVar13[8] = -(cStack_6d == '1');
            auVar13[9] = -(cStack_6c == '6');
            auVar13[10] = -(cStack_6b == '7');
            auVar13[0xb] = -(cStack_6a == '3');
            auVar13[0xc] = -(cStack_69 == '9');
            auVar13[0xd] = -(local_68 == '0');
            auVar13[0xe] = -(cStack_67 == '6');
            auVar13[0xf] = -(cStack_66 == '\0');
            auVar9[0] = -(local_78 == '3');
            auVar9[1] = -(cStack_77 == '3');
            auVar9[2] = -(cStack_76 == '1');
            auVar9[3] = -(cStack_75 == '6');
            auVar9[4] = -(cStack_74 == '1');
            auVar9[5] = -(cStack_73 == '3');
            auVar9[6] = -(cStack_72 == '3');
            auVar9[7] = -(cStack_71 == '9');
            auVar9[8] = -(cStack_70 == '0');
            auVar9[9] = -(cStack_6f == '5');
            auVar9[10] = -(cStack_6e == '2');
            auVar9[0xb] = -(cStack_6d == '1');
            auVar9[0xc] = -(cStack_6c == '6');
            auVar9[0xd] = -(cStack_6b == '7');
            auVar9[0xe] = -(cStack_6a == '3');
            auVar9[0xf] = -(cStack_69 == '9');
            auVar9 = auVar9 & auVar13;
            if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
              pcVar2 = "\"331613390521673906\"";
              pcVar4 = "331613390521673906";
              uVar3 = 0x123;
              goto LAB_00863c30;
            }
            if (local_80 == -0xec) {
              buffer_11._8_8_ = &local_7c;
              buffer_11.start_ = (char *)0x64;
              bVar1 = double_conversion::FastDtoa
                                ((double_conversion *)0x2,7.98851839160081e+191,4,(int)&local_78,
                                 buffer_11,&local_80,in_stack_ffffffffffffff78);
              if (!bVar1) {
                pcVar2 = "status";
                uVar3 = 0x128;
                goto LAB_00863bf8;
              }
              if (cStack_74 != '\0' ||
                  CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,local_78))) != 0x39383937
                 ) {
                pcVar2 = "\"7989\"";
                pcVar4 = "7989";
                uVar3 = 0x129;
                goto LAB_00863c30;
              }
              if (local_80 == 0xc0) {
                return;
              }
              uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
              pcVar2 = "192";
              uVar3 = 0x12a;
              uVar5 = 0xc0;
            }
            else {
              uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
              pcVar2 = "-236";
              uVar3 = 0x124;
              uVar5 = 0xffffff14;
            }
            goto LAB_00863c66;
          }
          uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
          uVar3 = 0x11e;
        }
        else {
          uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
          uVar3 = 0x115;
        }
        pcVar2 = "-307";
        uVar5 = 0xfffffecd;
        goto LAB_00863c66;
      }
      uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar3 = 0x10e;
    }
    else {
      uVar14 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar3 = 0xfa;
    }
    pcVar2 = "299";
    uVar5 = 299;
  }
LAB_00863c66:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
         ,uVar3,pcVar2,"point",uVar5,uVar14);
  abort();
}

Assistant:

TEST(FastDtoaPrecisionVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  status = FastDtoa(1.0, FAST_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK(status);
  CHECK(3 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  status = FastDtoa(1.5, FAST_DTOA_PRECISION, 10, buffer, &length, &point);
  if (status) {
    CHECK(10 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("15", buffer.start());
    CHECK_EQ(1, point);
  }

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_PRECISION, 7,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_PRECISION, 14,
                    buffer, &length, &point);
  if (status) {
    CHECK(14 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("4294967272", buffer.start());
    CHECK_EQ(10, point);
  }

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_PRECISION, 17,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("41855804968213567", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_PRECISION, 1,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_PRECISION, 10,
                    buffer, &length, &point);
  CHECK(status);
  CHECK(10 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK(20 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072009", buffer.start());
  CHECK_EQ(-307, point);

  v = 3.3161339052167390562200598e-237;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 18, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("331613390521673906", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);
}